

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O3

void __thiscall
GenericModelPrivate::moveRowsSameParent
          (GenericModelPrivate *this,QModelIndex *sourceParent,int sourceRow,int count,
          int destinationChild)

{
  GenericModelItem *this_00;
  iterator iVar1;
  GenericModelItem **ppGVar2;
  QMap<int,_QVariant> *pQVar3;
  QMap<int,_QVariant> *pQVar4;
  QMap<int,_QVariant> *pQVar5;
  QVector<RolesContainer> *this_01;
  
  ppGVar2 = (GenericModelItem **)&sourceParent->i;
  if (sourceParent->m == (QAbstractItemModel *)0x0) {
    ppGVar2 = &this->root;
  }
  if ((sourceParent->c | sourceParent->r) < 0) {
    ppGVar2 = &this->root;
  }
  this_00 = *ppGVar2;
  GenericModelItem::moveChildRows(this_00,sourceRow,count,destinationChild);
  if (this_00 == this->root) {
    this_01 = &this->vHeaderData;
    iVar1 = QList<QMap<int,_QVariant>_>::begin(this_01);
    pQVar5 = iVar1.i + sourceRow;
    iVar1 = QList<QMap<int,_QVariant>_>::begin(this_01);
    pQVar4 = iVar1.i + (long)sourceRow + (long)count;
    iVar1 = QList<QMap<int,_QVariant>_>::begin(this_01);
    pQVar3 = iVar1.i + destinationChild;
    if (destinationChild < sourceRow) {
      pQVar3 = pQVar4;
      pQVar4 = pQVar5;
      pQVar5 = iVar1.i + destinationChild;
    }
    std::_V2::__rotate<QList<QMap<int,QVariant>>::iterator>(pQVar5,pQVar4,pQVar3);
    return;
  }
  return;
}

Assistant:

void GenericModelPrivate::moveRowsSameParent(const QModelIndex &sourceParent, int sourceRow, int count, int destinationChild)
{
    GenericModelItem *item = itemForIndex(sourceParent);
    item->moveChildRows(sourceRow, count, destinationChild);
    if (item == root) {
        const auto sourceBegin = vHeaderData.begin() + sourceRow;
        const auto sourceEnd = vHeaderData.begin() + sourceRow + count;
        const auto destination = vHeaderData.begin() + destinationChild;
        if (destinationChild < sourceRow)
            std::rotate(destination, sourceBegin, sourceEnd);
        else
            std::rotate(sourceBegin, sourceEnd, destination);
    }
}